

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_del_(event *ev,int blocking)

{
  event_base *peVar1;
  int iVar2;
  
  peVar1 = ev->ev_base;
  if (peVar1 == (event_base *)0x0) {
    event_warnx("%s: event has no event_base set.","event_del_");
    iVar2 = -1;
  }
  else {
    if (peVar1->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,peVar1->th_base_lock);
    }
    iVar2 = event_del_nolock_(ev,blocking);
    if (peVar1->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,peVar1->th_base_lock);
    }
  }
  return iVar2;
}

Assistant:

static int
event_del_(struct event *ev, int blocking)
{
	int res;
	struct event_base *base = ev->ev_base;

	if (EVUTIL_FAILURE_CHECK(!base)) {
		event_warnx("%s: event has no event_base set.", __func__);
		return -1;
	}

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	res = event_del_nolock_(ev, blocking);
	EVBASE_RELEASE_LOCK(base, th_base_lock);

	return (res);
}